

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void __thiscall iqxmlrpc::Server::work(Server *this)

{
  int iVar1;
  Acceptor *this_00;
  Impl *pIVar2;
  
  pIVar2 = this->impl;
  if ((pIVar2->acceptor)._M_ptr == (Acceptor *)0x0) {
    this_00 = (Acceptor *)operator_new(0x48);
    iqnet::Acceptor::Acceptor
              (this_00,&pIVar2->bind_addr,(pIVar2->conn_factory)._M_ptr,(pIVar2->reactor)._M_ptr);
    std::auto_ptr<iqnet::Acceptor>::reset(&pIVar2->acceptor,this_00);
    iqnet::Acceptor::set_firewall((this->impl->acceptor)._M_ptr,this->impl->firewall);
  }
  do {
    pIVar2 = this->impl;
    if (pIVar2->exit_flag != false) goto LAB_00176d49;
    iVar1 = (*((pIVar2->reactor)._M_ptr)->_vptr_Reactor_base[6])();
  } while ((char)iVar1 != '\0');
  pIVar2 = this->impl;
LAB_00176d49:
  std::auto_ptr<iqnet::Acceptor>::reset(&pIVar2->acceptor,(element_type *)0x0);
  this->impl->exit_flag = false;
  return;
}

Assistant:

void Server::work()
{
  if( !impl->acceptor.get() )
  {
    impl->acceptor.reset(new iqnet::Acceptor( impl->bind_addr, get_conn_factory(), get_reactor()));
    impl->acceptor->set_firewall( impl->firewall );
  }

  for(bool have_handlers = true; have_handlers;)
  {
    if (impl->exit_flag)
      break;

    have_handlers = get_reactor()->handle_events();
  }

  impl->acceptor.reset(0);
  impl->exit_flag = false;
}